

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

hash_t __thiscall duckdb::TypeInfo::GetHash(TypeInfo *this)

{
  hash_t hVar1;
  hash_t hVar2;
  
  hVar1 = Hash<duckdb::LogicalTypeId>(this->type);
  hVar2 = Hash<char_const*>((this->alias)._M_dataplus._M_p);
  return hVar2 ^ hVar1;
}

Assistant:

hash_t TypeInfo::GetHash() const {
	const auto h_type_id = Hash(type);
	const auto h_alias = Hash(alias.c_str());
	return CombineHash(h_type_id, h_alias);
}